

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int hmode(CPURISCVState_conflict2 *env,int csrno)

{
  _Bool _Var1;
  int iVar2;
  int csrno_local;
  CPURISCVState_conflict2 *env_local;
  
  iVar2 = riscv_has_ext(env,0x40000);
  if (((iVar2 == 0) || (iVar2 = riscv_has_ext(env,0x80), iVar2 == 0)) ||
     (((env->priv != 1 ||
       (_Var1 = riscv_cpu_virt_enabled_riscv64((CPURISCVState_conflict1 *)env), _Var1)) &&
      (env->priv != 3)))) {
    env_local._4_4_ = -1;
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

static int hmode(CPURISCVState *env, int csrno)
{
    if (riscv_has_ext(env, RVS) &&
        riscv_has_ext(env, RVH)) {
        /* Hypervisor extension is supported */
        if ((env->priv == PRV_S && !riscv_cpu_virt_enabled(env)) ||
            env->priv == PRV_M) {
            return 0;
        }
    }

    return -1;
}